

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void tricore_tr_tb_stop(DisasContextBase_conflict1 *dcbase,CPUState_conflict *cpu)

{
  DisasJumpType DVar1;
  DisasContextBase_conflict1 *__mptr;
  DisasContext_conflict14 *ctx;
  CPUState_conflict *cpu_local;
  DisasContextBase_conflict1 *dcbase_local;
  
  DVar1 = dcbase->is_jmp;
  if (DVar1 == DISAS_TOO_MANY) {
    gen_goto_tb((DisasContext_conflict14 *)dcbase,0,dcbase->pc_next);
  }
  else if (DVar1 != DISAS_NORETURN) {
    if (DVar1 != DISAS_TARGET_6) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/tricore/translate.c"
                 ,0x2450,(char *)0x0);
    }
    gen_save_pc((DisasContext_conflict14 *)dcbase,dcbase->pc_next);
    gen_helper_uc_tricore_exit
              (*(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8),
               *(TCGv_ptr *)(*(long *)(*(long *)&dcbase[2].pc_first + 0x2e8) + 0x80f0));
  }
  return;
}

Assistant:

static void tricore_tr_tb_stop(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);

    // if (ctx->base.singlestep_enabled && ctx->base.is_jmp != DISAS_NORETURN) {
    //     save_cpu_state(ctx, ctx->base.is_jmp != DISAS_EXIT);
    //     gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
    // } else {
    switch (ctx->base.is_jmp) {
    case DISAS_TOO_MANY:
        gen_goto_tb(ctx, 0, ctx->base.pc_next);
        break;
    case DISAS_UC_EXIT:
        gen_save_pc(ctx, ctx->base.pc_next);
        gen_helper_uc_tricore_exit(ctx->uc->tcg_ctx, ctx->uc->tcg_ctx->cpu_env);
        break;
    case DISAS_NORETURN:
        break;
    default:
        g_assert_not_reached();
    }
}